

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.h
# Opt level: O3

void __thiscall Response::Response(Response *this,string *type)

{
  value_t t;
  json_value jVar1;
  reference pvVar2;
  json_value local_20;
  
  (this->content).m_type = null;
  (this->content).m_value.object = (object_t *)0x0;
  local_20.object = (object_t *)0x0;
  local_20.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(type);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"type");
  t = pvVar2->m_type;
  pvVar2->m_type = string;
  jVar1 = pvVar2->m_value;
  (pvVar2->m_value).object = (object_t *)local_20;
  local_20 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_20.boolean,t);
  return;
}

Assistant:

Response(const std::string &type) { content["type"] = type; }